

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O1

bool __thiscall ON_ErrorLog::EnableLogging(ON_ErrorLog *this)

{
  bool bVar1;
  
  bVar1 = true;
  if (((ON_ACTIVE_ERROR_LOG != this) && (bVar1 = false, ON_ACTIVE_ERROR_LOG == (ON_ErrorLog *)0x0))
     && (this->m_event_count < 0x20)) {
    bVar1 = true;
    ON_ACTIVE_ERROR_LOG = this;
  }
  return bVar1;
}

Assistant:

bool ON_ErrorLog::EnableLogging()
{
  if ( 0 == ((ON__UINT_PTR)this) )
    return false;
  if (this == ON_ACTIVE_ERROR_LOG)
    return true;
  if (nullptr != ON_ACTIVE_ERROR_LOG)
    return false;
  if (Count() >= ON_ErrorLog::MaximumEventCount)
    return false;

  ON_ACTIVE_ERROR_LOG = this;
  return true;
}